

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_token_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::TrustTokenMetadataTest_ExcessDataProof_Test::TestBody
          (TrustTokenMetadataTest_ExcessDataProof_Test *this)

{
  bool bVar1;
  uint32_t public_metadata;
  TRUST_TOKEN_METHOD *pTVar2;
  pointer ptVar3;
  char *pcVar4;
  pointer ctx;
  cbb_st *pcVar5;
  char *pcVar6;
  TRUST_TOKEN_METHOD *pTVar7;
  uint8_t *puVar8;
  size_t len;
  stack_st_TRUST_TOKEN *__p;
  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
  _Var9;
  char *in_R9;
  string local_610;
  AssertHelper local_5f0;
  Message local_5e8;
  bool local_5d9;
  undefined1 local_5d8 [8];
  AssertionResult gtest_ar__16;
  UniquePtr<struct_stack_st_TRUST_TOKEN> tokens;
  size_t key_index;
  UniquePtr<uint8_t> free_bad;
  AssertHelper local_590;
  Message local_588;
  int local_57c;
  undefined1 local_578 [8];
  AssertionResult gtest_ar__15;
  size_t bad_len;
  uint8_t *bad_buf;
  AssertHelper local_538;
  Message local_530;
  int local_524;
  undefined1 local_520 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_4f0;
  Message local_4e8;
  int local_4dc;
  undefined1 local_4d8 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_4a8;
  Message local_4a0;
  int local_494;
  undefined1 local_490 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_460;
  Message local_458;
  int local_44c;
  undefined1 local_448 [8];
  AssertionResult gtest_ar__11;
  CBB dleq;
  AssertHelper local_3e8;
  Message local_3e0;
  int local_3d4;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar__10;
  CBS tmp;
  AssertHelper local_390;
  Message local_388;
  int local_37c;
  undefined1 local_378 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_348;
  Message local_340;
  int local_334;
  undefined1 local_330 [8];
  AssertionResult gtest_ar__8;
  size_t i;
  size_t token_length;
  size_t kP384PointLen;
  AssertHelper local_2e8;
  Message local_2e0;
  int local_2d4;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_2a0;
  Message local_298;
  int local_28c;
  undefined1 local_288 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_258;
  Message local_250;
  int local_244;
  undefined1 local_240 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_210;
  Message local_208;
  int local_1fc;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_1c8;
  Message local_1c0;
  int local_1b4;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar__3;
  ScopedCBB bad_response;
  uint32_t parsed_public_metadata;
  uint16_t count;
  CBS real_response;
  UniquePtr<uint8_t> free_msg;
  AssertHelper local_130;
  Message local_128;
  int local_11c;
  undefined1 local_118 [8];
  AssertionResult gtest_ar__2;
  size_t tokens_issued;
  UniquePtr<uint8_t> free_issue_msg;
  AssertHelper local_d8;
  Message local_d0;
  int local_c4;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_90;
  Message local_88;
  int local_7c;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_;
  size_t resp_len;
  size_t msg_len;
  uint8_t *issue_resp;
  uint8_t *issue_msg;
  Message local_40;
  uint local_38;
  undefined1 local_28 [8];
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  TrustTokenMetadataTest_ExcessDataProof_Test *this_local;
  
  gtest_fatal_failure_checker.original_reporter_ = (TestPartResultReporterInterface *)this;
  pTVar2 = TrustTokenProtocolTestBase::method((TrustTokenProtocolTestBase *)this);
  if ((pTVar2->has_private_metadata == 0) &&
     (bVar1 = TrustTokenMetadataTest::private_metadata(&this->super_TrustTokenMetadataTest), bVar1))
  {
    return;
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (!bVar1) {
LAB_00570072:
    testing::Message::Message(&local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&issue_msg,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
               ,0x45e,
               "Expected: SetupContexts() doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&issue_msg,&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&issue_msg);
    testing::Message::~Message(&local_40);
    return;
  }
  testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
            ((HasNewFatalFailureHelper *)local_28);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    TrustTokenProtocolTestBase::SetupContexts((TrustTokenProtocolTestBase *)this);
  }
  bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure
                    ((HasNewFatalFailureHelper *)local_28);
  if (bVar1) {
    local_38 = 2;
  }
  else {
    local_38 = 0;
  }
  testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
            ((HasNewFatalFailureHelper *)local_28);
  if (local_38 != 0) goto LAB_00570072;
  issue_resp = (uint8_t *)0x0;
  msg_len = 0;
  bVar1 = TrustTokenProtocolTestBase::use_message((TrustTokenProtocolTestBase *)this);
  if (bVar1) {
    ptVar3 = std::unique_ptr<trust_token_client_st,_bssl::internal::Deleter>::get
                       (&(this->super_TrustTokenMetadataTest).super_TrustTokenProtocolTestBase.
                         client);
    pcVar4 = (char *)0x4;
    local_7c = TRUST_TOKEN_CLIENT_begin_issuance_over_message
                         (ptVar3,&issue_resp,&resp_len,10,"MSG",4);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_78,&local_7c,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
    if (!bVar1) {
      testing::Message::Message(&local_88);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__1.message_,(internal *)local_78,
                 (AssertionResult *)
                 "TRUST_TOKEN_CLIENT_begin_issuance_over_message( client.get(), &issue_msg, &msg_len, 10, kMessage, sizeof(kMessage))"
                 ,"false","true",pcVar4);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x464,pcVar4);
      testing::internal::AssertHelper::operator=(&local_90,&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_88);
    }
    local_38 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  }
  else {
    ptVar3 = std::unique_ptr<trust_token_client_st,_bssl::internal::Deleter>::get
                       (&(this->super_TrustTokenMetadataTest).super_TrustTokenProtocolTestBase.
                         client);
    local_c4 = TRUST_TOKEN_CLIENT_begin_issuance(ptVar3,&issue_resp,&resp_len,10);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_c0,&local_c4,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
    if (!bVar1) {
      testing::Message::Message(&local_d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&free_issue_msg,(internal *)local_c0,
                 (AssertionResult *)
                 "TRUST_TOKEN_CLIENT_begin_issuance(client.get(), &issue_msg, &msg_len, 10)","false"
                 ,"true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x467,pcVar4);
      testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_d8);
      std::__cxx11::string::~string((string *)&free_issue_msg);
      testing::Message::~Message(&local_d0);
    }
    local_38 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  }
  if (local_38 != 0) {
    return;
  }
  std::unique_ptr<unsigned_char,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)&tokens_issued,issue_resp);
  ctx = std::unique_ptr<trust_token_issuer_st,_bssl::internal::Deleter>::get
                  (&(this->super_TrustTokenMetadataTest).super_TrustTokenProtocolTestBase.issuer);
  puVar8 = issue_resp;
  public_metadata = TrustTokenMetadataTest::public_metadata(&this->super_TrustTokenMetadataTest);
  bVar1 = TrustTokenMetadataTest::private_metadata(&this->super_TrustTokenMetadataTest);
  local_11c = TRUST_TOKEN_ISSUER_issue
                        (ctx,(uint8_t **)&msg_len,(size_t *)&gtest_ar_.message_,
                         (size_t *)&gtest_ar__2.message_,puVar8,resp_len,public_metadata,bVar1,1);
  testing::AssertionResult::AssertionResult<int>
            ((AssertionResult *)local_118,&local_11c,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  pcVar4 = (char *)resp_len;
  if (!bVar1) {
    testing::Message::Message(&local_128);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&free_msg,(internal *)local_118,
               (AssertionResult *)
               "TRUST_TOKEN_ISSUER_issue( issuer.get(), &issue_resp, &resp_len, &tokens_issued, issue_msg, msg_len, public_metadata(), private_metadata(), 1)"
               ,"false","true",(char *)resp_len);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
               ,0x46d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_130,&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    std::__cxx11::string::~string((string *)&free_msg);
    testing::Message::~Message(&local_128);
    pcVar4 = (char *)resp_len;
  }
  local_38 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  if (local_38 != 0) goto LAB_00571eaf;
  std::unique_ptr<unsigned_char,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)&real_response.len,
             (pointer)msg_len);
  CBS_init((CBS *)&parsed_public_metadata,(uint8_t *)msg_len,
           (size_t)gtest_ar_.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl);
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&gtest_ar__3.message_);
  pcVar5 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                     ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&gtest_ar__3.message_
                     );
  local_1b4 = CBB_init(pcVar5,0);
  testing::AssertionResult::AssertionResult<int>
            ((AssertionResult *)local_1b0,&local_1b4,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_1b0,
               (AssertionResult *)"CBB_init(bad_response.get(), 0)","false","true",pcVar4);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
               ,0x475,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_1c0);
  }
  local_38 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  if (local_38 == 0) {
    local_1fc = CBS_get_u16((CBS *)&parsed_public_metadata,
                            (uint16_t *)((long)&bad_response.ctx_.u + 0x1e));
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_1f8,&local_1fc,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
    if (!bVar1) {
      testing::Message::Message(&local_208);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__5.message_,(internal *)local_1f8,
                 (AssertionResult *)"CBS_get_u16(&real_response, &count)","false","true",pcVar4);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_210,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                 ,0x476,pcVar6);
      testing::internal::AssertHelper::operator=(&local_210,&local_208);
      testing::internal::AssertHelper::~AssertHelper(&local_210);
      std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
      testing::Message::~Message(&local_208);
    }
    local_38 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
    if (local_38 == 0) {
      pcVar5 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                         ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                          &gtest_ar__3.message_);
      local_244 = CBB_add_u16(pcVar5,bad_response.ctx_.u._30_2_);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_240,&local_244,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
      if (!bVar1) {
        testing::Message::Message(&local_250);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__6.message_,(internal *)local_240,
                   (AssertionResult *)"CBB_add_u16(bad_response.get(), count)","false","true",pcVar4
                  );
        pcVar6 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_258,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                   ,0x477,pcVar6);
        testing::internal::AssertHelper::operator=(&local_258,&local_250);
        testing::internal::AssertHelper::~AssertHelper(&local_258);
        std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
        testing::Message::~Message(&local_250);
      }
      local_38 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
      if (local_38 == 0) {
        local_28c = CBS_get_u32((CBS *)&parsed_public_metadata,
                                (uint32_t *)((long)&bad_response.ctx_.u + 0x18));
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_288,&local_28c,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
        if (!bVar1) {
          testing::Message::Message(&local_298);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__7.message_,(internal *)local_288,
                     (AssertionResult *)"CBS_get_u32(&real_response, &parsed_public_metadata)",
                     "false","true",pcVar4);
          pcVar6 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_2a0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                     ,0x478,pcVar6);
          testing::internal::AssertHelper::operator=(&local_2a0,&local_298);
          testing::internal::AssertHelper::~AssertHelper(&local_2a0);
          std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
          testing::Message::~Message(&local_298);
        }
        local_38 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
        if (local_38 == 0) {
          pcVar5 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                             ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                              &gtest_ar__3.message_);
          local_2d4 = CBB_add_u32(pcVar5,bad_response.ctx_.u._24_4_);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_2d0,&local_2d4,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
          if (!bVar1) {
            testing::Message::Message(&local_2e0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&kP384PointLen,(internal *)local_2d0,
                       (AssertionResult *)"CBB_add_u32(bad_response.get(), parsed_public_metadata)",
                       "false","true",pcVar4);
            pcVar6 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_2e8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                       ,0x479,pcVar6);
            testing::internal::AssertHelper::operator=(&local_2e8,&local_2e0);
            testing::internal::AssertHelper::~AssertHelper(&local_2e8);
            std::__cxx11::string::~string((string *)&kP384PointLen);
            testing::Message::~Message(&local_2e0);
          }
          local_38 = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
          if (local_38 == 0) {
            i = 0x102;
            pTVar2 = TrustTokenProtocolTestBase::method((TrustTokenProtocolTestBase *)this);
            pTVar7 = TRUST_TOKEN_experiment_v1();
            if (pTVar2 == pTVar7) {
              i = 0x106;
            }
            pTVar2 = TrustTokenProtocolTestBase::method((TrustTokenProtocolTestBase *)this);
            pTVar7 = TRUST_TOKEN_experiment_v2_voprf();
            if (pTVar2 == pTVar7) {
LAB_00570f64:
              i = 0x61;
            }
            else {
              pTVar2 = TrustTokenProtocolTestBase::method((TrustTokenProtocolTestBase *)this);
              pTVar7 = TRUST_TOKEN_pst_v1_voprf();
              if (pTVar2 == pTVar7) goto LAB_00570f64;
            }
            for (gtest_ar__8.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl =
                      (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                       )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0;
                _Var9.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._2_6_ = 0,
                _Var9.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._0_2_ = bad_response.ctx_.u._30_2_,
                (ulong)gtest_ar__8.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl <
                (ulong)_Var9.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
                gtest_ar__8.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )((long)gtest_ar__8.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 1)) {
              pcVar5 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                 ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                  &gtest_ar__3.message_);
              puVar8 = CBS_data((CBS *)&parsed_public_metadata);
              local_334 = CBB_add_bytes(pcVar5,puVar8,i);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_330,&local_334,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
              if (!bVar1) {
                testing::Message::Message(&local_340);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__9.message_,(internal *)local_330,
                           (AssertionResult *)
                           "CBB_add_bytes(bad_response.get(), CBS_data(&real_response), token_length)"
                           ,"false","true",pcVar4);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_348,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                           ,0x486,pcVar6);
                testing::internal::AssertHelper::operator=(&local_348,&local_340);
                testing::internal::AssertHelper::~AssertHelper(&local_348);
                std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
                testing::Message::~Message(&local_340);
              }
              local_38 = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
              if (local_38 != 0) goto LAB_00571e97;
              local_37c = CBS_skip((CBS *)&parsed_public_metadata,i);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_378,&local_37c,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
              if (!bVar1) {
                testing::Message::Message(&local_388);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&tmp.len,(internal *)local_378,
                           (AssertionResult *)"CBS_skip(&real_response, token_length)","false",
                           "true",pcVar4);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_390,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                           ,0x487,pcVar6);
                testing::internal::AssertHelper::operator=(&local_390,&local_388);
                testing::internal::AssertHelper::~AssertHelper(&local_390);
                std::__cxx11::string::~string((string *)&tmp.len);
                testing::Message::~Message(&local_388);
              }
              local_38 = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
              if (local_38 != 0) goto LAB_00571e97;
            }
            local_3d4 = CBS_get_u16_length_prefixed
                                  ((CBS *)&parsed_public_metadata,(CBS *)&gtest_ar__10.message_);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_3d0,&local_3d4,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
            if (!bVar1) {
              testing::Message::Message(&local_3e0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)((long)&dleq.u + 0x18),(internal *)local_3d0,
                         (AssertionResult *)"CBS_get_u16_length_prefixed(&real_response, &tmp)",
                         "false","true",pcVar4);
              pcVar6 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_3e8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                         ,0x48b,pcVar6);
              testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
              testing::internal::AssertHelper::~AssertHelper(&local_3e8);
              std::__cxx11::string::~string((string *)((long)&dleq.u + 0x18));
              testing::Message::~Message(&local_3e0);
            }
            local_38 = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
            if (local_38 == 0) {
              pcVar5 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                 ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                  &gtest_ar__3.message_);
              local_44c = CBB_add_u16_length_prefixed(pcVar5,(CBB *)&gtest_ar__11.message_);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_448,&local_44c,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
              if (!bVar1) {
                testing::Message::Message(&local_458);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__12.message_,(internal *)local_448,
                           (AssertionResult *)
                           "CBB_add_u16_length_prefixed(bad_response.get(), &dleq)","false","true",
                           pcVar4);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_460,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                           ,0x48d,pcVar6);
                testing::internal::AssertHelper::operator=(&local_460,&local_458);
                testing::internal::AssertHelper::~AssertHelper(&local_460);
                std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
                testing::Message::~Message(&local_458);
              }
              local_38 = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
              if (local_38 == 0) {
                puVar8 = CBS_data((CBS *)&gtest_ar__10.message_);
                len = CBS_len((CBS *)&gtest_ar__10.message_);
                local_494 = CBB_add_bytes((CBB *)&gtest_ar__11.message_,puVar8,len);
                testing::AssertionResult::AssertionResult<int>
                          ((AssertionResult *)local_490,&local_494,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_490);
                if (!bVar1) {
                  testing::Message::Message(&local_4a0);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__13.message_,(internal *)local_490,
                             (AssertionResult *)
                             "CBB_add_bytes(&dleq, CBS_data(&tmp), CBS_len(&tmp))","false","true",
                             pcVar4);
                  pcVar6 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_4a8,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                             ,0x48e,pcVar6);
                  testing::internal::AssertHelper::operator=(&local_4a8,&local_4a0);
                  testing::internal::AssertHelper::~AssertHelper(&local_4a8);
                  std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
                  testing::Message::~Message(&local_4a0);
                }
                local_38 = (uint)!bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
                if (local_38 == 0) {
                  local_4dc = CBB_add_u16((CBB *)&gtest_ar__11.message_,0x2a);
                  testing::AssertionResult::AssertionResult<int>
                            ((AssertionResult *)local_4d8,&local_4dc,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_4d8);
                  if (!bVar1) {
                    testing::Message::Message(&local_4e8);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__14.message_,(internal *)local_4d8,
                               (AssertionResult *)"CBB_add_u16(&dleq, 42)","false","true",pcVar4);
                    pcVar6 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_4f0,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                               ,0x48f,pcVar6);
                    testing::internal::AssertHelper::operator=(&local_4f0,&local_4e8);
                    testing::internal::AssertHelper::~AssertHelper(&local_4f0);
                    std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
                    testing::Message::~Message(&local_4e8);
                  }
                  local_38 = (uint)!bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d8);
                  if (local_38 == 0) {
                    pcVar5 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                        &gtest_ar__3.message_);
                    local_524 = CBB_flush(pcVar5);
                    testing::AssertionResult::AssertionResult<int>
                              ((AssertionResult *)local_520,&local_524,(type *)0x0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_520);
                    if (!bVar1) {
                      testing::Message::Message(&local_530);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&bad_buf,(internal *)local_520,
                                 (AssertionResult *)"CBB_flush(bad_response.get())","false","true",
                                 pcVar4);
                      pcVar6 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_538,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                                 ,0x490,pcVar6);
                      testing::internal::AssertHelper::operator=(&local_538,&local_530);
                      testing::internal::AssertHelper::~AssertHelper(&local_538);
                      std::__cxx11::string::~string((string *)&bad_buf);
                      testing::Message::~Message(&local_530);
                    }
                    local_38 = (uint)!bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_520);
                    if (local_38 == 0) {
                      pcVar5 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                         ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                          &gtest_ar__3.message_);
                      local_57c = CBB_finish(pcVar5,(uint8_t **)&bad_len,
                                             (size_t *)&gtest_ar__15.message_);
                      testing::AssertionResult::AssertionResult<int>
                                ((AssertionResult *)local_578,&local_57c,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_578);
                      if (!bVar1) {
                        testing::Message::Message(&local_588);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&free_bad,(internal *)local_578,
                                   (AssertionResult *)
                                   "CBB_finish(bad_response.get(), &bad_buf, &bad_len)","false",
                                   "true",pcVar4);
                        pcVar6 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_590,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                                   ,0x494,pcVar6);
                        testing::internal::AssertHelper::operator=(&local_590,&local_588);
                        testing::internal::AssertHelper::~AssertHelper(&local_590);
                        std::__cxx11::string::~string((string *)&free_bad);
                        testing::Message::~Message(&local_588);
                      }
                      local_38 = (uint)!bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_578);
                      if (local_38 == 0) {
                        std::unique_ptr<unsigned_char,bssl::internal::Deleter>::
                        unique_ptr<bssl::internal::Deleter,void>
                                  ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)&key_index,
                                   (pointer)bad_len);
                        ptVar3 = std::unique_ptr<trust_token_client_st,_bssl::internal::Deleter>::
                                 get(&(this->super_TrustTokenMetadataTest).
                                      super_TrustTokenProtocolTestBase.client);
                        __p = TRUST_TOKEN_CLIENT_finish_issuance
                                        (ptVar3,(size_t *)&tokens,(uint8_t *)bad_len,
                                         (size_t)gtest_ar__15.message_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl);
                        std::unique_ptr<stack_st_TRUST_TOKEN,bssl::internal::Deleter>::
                        unique_ptr<bssl::internal::Deleter,void>
                                  ((unique_ptr<stack_st_TRUST_TOKEN,bssl::internal::Deleter> *)
                                   &gtest_ar__16.message_,__p);
                        bVar1 = std::unique_ptr::operator_cast_to_bool
                                          ((unique_ptr *)&gtest_ar__16.message_);
                        local_5d9 = !bVar1;
                        testing::AssertionResult::AssertionResult<bool>
                                  ((AssertionResult *)local_5d8,&local_5d9,(type *)0x0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_5d8);
                        if (!bVar1) {
                          testing::Message::Message(&local_5e8);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    (&local_610,(internal *)local_5d8,(AssertionResult *)"tokens",
                                     "true","false",pcVar4);
                          pcVar4 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_5f0,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token_test.cc"
                                     ,0x49b,pcVar4);
                          testing::internal::AssertHelper::operator=(&local_5f0,&local_5e8);
                          testing::internal::AssertHelper::~AssertHelper(&local_5f0);
                          std::__cxx11::string::~string((string *)&local_610);
                          testing::Message::~Message(&local_5e8);
                        }
                        local_38 = (uint)!bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d8);
                        if (local_38 == 0) {
                          local_38 = 0;
                        }
                        std::unique_ptr<stack_st_TRUST_TOKEN,_bssl::internal::Deleter>::~unique_ptr
                                  ((unique_ptr<stack_st_TRUST_TOKEN,_bssl::internal::Deleter> *)
                                   &gtest_ar__16.message_);
                        std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                                  ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&key_index)
                        ;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00571e97:
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&gtest_ar__3.message_);
  std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&real_response.len);
LAB_00571eaf:
  std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&tokens_issued);
  return;
}

Assistant:

TEST_P(TrustTokenMetadataTest, ExcessDataProof) {
  if (!method()->has_private_metadata && private_metadata()) {
    return;
  }

  ASSERT_NO_FATAL_FAILURE(SetupContexts());

  uint8_t *issue_msg = NULL, *issue_resp = NULL;
  size_t msg_len, resp_len;
  if (use_message()) {
    ASSERT_TRUE(TRUST_TOKEN_CLIENT_begin_issuance_over_message(
        client.get(), &issue_msg, &msg_len, 10, kMessage, sizeof(kMessage)));
  } else {
    ASSERT_TRUE(TRUST_TOKEN_CLIENT_begin_issuance(client.get(), &issue_msg,
                                                  &msg_len, 10));
  }
  bssl::UniquePtr<uint8_t> free_issue_msg(issue_msg);
  size_t tokens_issued;
  ASSERT_TRUE(TRUST_TOKEN_ISSUER_issue(
      issuer.get(), &issue_resp, &resp_len, &tokens_issued, issue_msg, msg_len,
      public_metadata(), private_metadata(), /*max_issuance=*/1));
  bssl::UniquePtr<uint8_t> free_msg(issue_resp);

  CBS real_response;
  CBS_init(&real_response, issue_resp, resp_len);
  uint16_t count;
  uint32_t parsed_public_metadata;
  bssl::ScopedCBB bad_response;
  ASSERT_TRUE(CBB_init(bad_response.get(), 0));
  ASSERT_TRUE(CBS_get_u16(&real_response, &count));
  ASSERT_TRUE(CBB_add_u16(bad_response.get(), count));
  ASSERT_TRUE(CBS_get_u32(&real_response, &parsed_public_metadata));
  ASSERT_TRUE(CBB_add_u32(bad_response.get(), parsed_public_metadata));

  const size_t kP384PointLen = 1 + 2 * (384 / 8);
  size_t token_length = TRUST_TOKEN_NONCE_SIZE + 2 * kP384PointLen;
  if (method() == TRUST_TOKEN_experiment_v1()) {
    token_length += 4;
  }
  if (method() == TRUST_TOKEN_experiment_v2_voprf() ||
      method() == TRUST_TOKEN_pst_v1_voprf()) {
    token_length = kP384PointLen;
  }
  for (size_t i = 0; i < count; i++) {
    ASSERT_TRUE(CBB_add_bytes(bad_response.get(), CBS_data(&real_response),
                              token_length));
    ASSERT_TRUE(CBS_skip(&real_response, token_length));
  }

  CBS tmp;
  ASSERT_TRUE(CBS_get_u16_length_prefixed(&real_response, &tmp));
  CBB dleq;
  ASSERT_TRUE(CBB_add_u16_length_prefixed(bad_response.get(), &dleq));
  ASSERT_TRUE(CBB_add_bytes(&dleq, CBS_data(&tmp), CBS_len(&tmp)));
  ASSERT_TRUE(CBB_add_u16(&dleq, 42));
  ASSERT_TRUE(CBB_flush(bad_response.get()));

  uint8_t *bad_buf;
  size_t bad_len;
  ASSERT_TRUE(CBB_finish(bad_response.get(), &bad_buf, &bad_len));
  bssl::UniquePtr<uint8_t> free_bad(bad_buf);

  size_t key_index;
  bssl::UniquePtr<STACK_OF(TRUST_TOKEN)> tokens(
      TRUST_TOKEN_CLIENT_finish_issuance(client.get(), &key_index, bad_buf,
                                         bad_len));
  ASSERT_FALSE(tokens);
}